

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

bool __thiscall miniscript::Node<CPubKey>::IsSane(Node<CPubKey> *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsValid(this);
  bVar3 = false;
  if ((bVar2) && (bVar3 = false, ((this->typ).m_flags & 1) != 0)) {
    bVar3 = ValidSatisfactions(this);
    if ((bVar3) && ((~(this->typ).m_flags & 0x41000) == 0)) {
      bVar3 = false;
      if (((this->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_engaged == true) &&
         (bVar3 = false,
         ((this->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>._M_payload._M_value & 1U) == 0)) {
        bVar3 = (bool)((*(byte *)((long)&(this->typ).m_flags + 1) & 8) >> 3);
      }
    }
    else {
      bVar3 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSane() const { return IsValidTopLevel() && IsSaneSubexpression() && NeedsSignature(); }